

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmcmd.cxx
# Opt level: O2

int __thiscall cmVSLink::LinkNonIncremental(cmVSLink *this)

{
  bool bVar1;
  int iVar2;
  char *__rhs;
  string mtOut;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  bVar1 = RunCommand("LINK",&this->LinkCommand,this->Verbose,FORMAT_DECIMAL,(int *)0x0,
                     (_func_bool_int *)0x0);
  if (bVar1) {
    if ((this->LinkGeneratesManifest == false) &&
       ((this->UserManifests).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->UserManifests).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      iVar2 = 0;
    }
    else {
      std::operator+(&local_30,"/outputresource:",&this->TargetFile);
      __rhs = ";#2";
      if (this->Type == 1) {
        __rhs = ";#1";
      }
      std::operator+(&mtOut,&local_30,__rhs);
      std::__cxx11::string::~string((string *)&local_30);
      iVar2 = RunMT(this,&mtOut,false);
      std::__cxx11::string::~string((string *)&mtOut);
    }
  }
  else {
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int cmVSLink::LinkNonIncremental()
{
  // Run the link command (possibly generates intermediate manifest).
  if (!RunCommand("LINK", this->LinkCommand, this->Verbose, FORMAT_DECIMAL)) {
    return -1;
  }

  // If we have no manifest files we are done.
  if (!this->LinkGeneratesManifest && this->UserManifests.empty()) {
    return 0;
  }

  // Run the manifest tool to embed the final manifest in the binary.
  std::string mtOut =
    "/outputresource:" + this->TargetFile + (this->Type == 1 ? ";#1" : ";#2");
  return this->RunMT(mtOut, false);
}